

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur_device.cpp
# Opt level: O0

void embree::sphereIntersectFunc(RTCIntersectFunctionNArguments *args)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined8 *in_RDI;
  float fVar8;
  Vec3fa Ng_1;
  Vec3fa Ng;
  RTCHit potentialHit;
  float t1;
  float t0;
  float rcpA;
  float Q;
  float D;
  float C;
  float B;
  float A;
  Vec3fa v;
  Sphere *sphere;
  Sphere *spheres;
  uint primID;
  RTCHit *hit;
  Ray *ray;
  void *ptr;
  int *valid;
  __m128 r;
  __m128 a_3;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  vfloat4 c_1;
  vfloat4 b_1;
  vfloat4 a_1;
  vfloat4 c_2;
  vfloat4 b_2;
  vfloat4 a_2;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined1 local_e48 [16];
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined1 local_e08 [16];
  float local_df8;
  float local_df4;
  float local_df0;
  undefined4 local_dec;
  undefined4 local_de8;
  uint local_de4;
  undefined4 local_de0;
  float local_dc0;
  float local_dbc;
  float local_db8;
  float local_db4;
  float local_db0;
  float local_dac;
  undefined8 local_da8;
  undefined8 uStack_da0;
  float local_d90;
  float local_d8c;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 *local_d60;
  long local_d58;
  uint local_d4c;
  undefined8 *local_d48;
  undefined8 *local_d40;
  long local_d38;
  int *local_d30;
  undefined8 *local_d20;
  undefined8 *local_d18;
  undefined1 *local_d10;
  undefined8 *local_d08;
  undefined8 *local_d00;
  undefined1 *local_cf8;
  undefined8 *local_cf0;
  undefined8 *local_ce8;
  undefined8 *local_ce0;
  undefined8 *local_cd8;
  undefined8 *local_cd0;
  undefined8 *local_cc8;
  undefined8 *local_cc0;
  undefined8 *local_cb8;
  undefined8 *local_cb0;
  undefined8 *local_ca8;
  undefined8 *local_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 *local_c88;
  undefined8 *local_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 *local_c40;
  undefined8 *local_c38;
  float local_c30;
  float local_c2c;
  undefined1 local_c28 [16];
  ulong local_c18;
  undefined8 uStack_c10;
  float local_bfc;
  undefined8 *local_bf8;
  undefined8 *local_bf0;
  undefined1 *local_be8;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  undefined8 *local_bc8;
  undefined8 *local_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 *local_ba0;
  float local_b94;
  undefined1 *local_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 *local_b70;
  float local_b64;
  undefined8 *local_b60;
  float local_b54;
  undefined8 *local_b50;
  float local_b44;
  undefined8 *local_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 *local_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 *local_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 *local_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 *local_a60;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  undefined8 *local_a40;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  undefined1 *local_a20;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  undefined1 *local_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 *local_9a8;
  undefined8 *local_9a0;
  undefined8 *local_998;
  undefined8 *local_990;
  undefined8 *local_988;
  undefined8 *local_980;
  undefined1 *local_978;
  undefined8 *local_970;
  undefined8 *local_968;
  undefined8 *local_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 *local_940;
  undefined8 *local_938;
  undefined8 *local_930;
  undefined8 *local_928;
  undefined8 *local_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 *local_8f0;
  undefined8 *local_8e8;
  undefined8 *local_8e0;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined8 *local_8c8;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  undefined8 *local_898;
  undefined8 *local_890;
  undefined8 *local_888;
  undefined8 *local_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 *local_860;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 *local_830;
  undefined8 *local_828;
  undefined8 *local_820;
  undefined8 *local_818;
  undefined8 *local_810;
  undefined8 *local_808;
  undefined8 *local_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 *local_7e0;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 *local_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  undefined8 *local_6b0;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  undefined1 *local_690;
  float local_688;
  float fStack_684;
  float fStack_680;
  float fStack_67c;
  undefined8 *local_670;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  undefined8 *local_650;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  undefined8 *local_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 *local_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  undefined8 *local_598;
  undefined8 *local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 *local_570;
  undefined8 *local_568;
  undefined8 *local_560;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined8 *local_548;
  undefined8 *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined8 *local_518;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 *local_4e0;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 *local_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 *local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 *local_370;
  undefined8 *local_368;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined8 *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined8 *local_308;
  undefined8 *local_300;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 *local_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 *local_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 *local_140;
  undefined8 *local_138;
  undefined8 *local_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  undefined4 local_cc;
  undefined1 local_c8 [16];
  float local_ac;
  ulong local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  ulong local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  float fStack_8;
  
  local_d30 = (int *)*in_RDI;
  local_d58 = in_RDI[1];
  local_d40 = (undefined8 *)in_RDI[4];
  local_d48 = local_d40 + 6;
  local_d4c = *(uint *)(in_RDI + 2);
  if ((*(int *)(in_RDI + 5) == 1) &&
     (local_d60 = (undefined8 *)(local_d58 + (ulong)local_d4c * 0x30), *local_d30 != 0)) {
    *local_d30 = 0;
    local_ce8 = &local_d88;
    local_ad8 = *local_d40;
    uStack_ad0 = local_d40[1];
    local_ce0 = &local_d78;
    uVar1 = *local_d60;
    uVar2 = local_d60[1];
    local_b28._0_4_ = (float)local_ad8;
    local_b28._4_4_ = (float)((ulong)local_ad8 >> 0x20);
    uStack_b20._0_4_ = (float)uStack_ad0;
    uStack_b20._4_4_ = (float)((ulong)uStack_ad0 >> 0x20);
    local_b38._0_4_ = (float)uVar1;
    local_b38._4_4_ = (float)((ulong)uVar1 >> 0x20);
    uStack_b30._0_4_ = (float)uVar2;
    uStack_b30._4_4_ = (float)((ulong)uVar2 >> 0x20);
    local_a58 = (float)local_b28 - (float)local_b38;
    fStack_a54 = local_b28._4_4_ - local_b38._4_4_;
    fStack_a50 = (float)uStack_b20 - (float)uStack_b30;
    fStack_a4c = uStack_b20._4_4_ - uStack_b30._4_4_;
    local_158 = CONCAT44(fStack_a54,local_a58);
    uStack_150 = CONCAT44(fStack_a4c,fStack_a50);
    local_c88 = local_d40 + 2;
    local_9a8 = &local_c98;
    uVar3 = *local_c88;
    uVar4 = local_d40[3];
    uVar5 = *local_c88;
    uVar6 = local_d40[3];
    local_718._0_4_ = (float)uVar3;
    local_718._4_4_ = (float)((ulong)uVar3 >> 0x20);
    uStack_710._0_4_ = (float)uVar4;
    uStack_710._4_4_ = (float)((ulong)uVar4 >> 0x20);
    local_728._0_4_ = (float)uVar5;
    local_728._4_4_ = (float)((ulong)uVar5 >> 0x20);
    uStack_720._0_4_ = (float)uVar6;
    uStack_720._4_4_ = (float)((ulong)uVar6 >> 0x20);
    local_6c8 = (float)local_718 * (float)local_728;
    local_858 = local_718._4_4_ * local_728._4_4_;
    local_7d8 = (float)uStack_710 * (float)uStack_720;
    fStack_6bc = uStack_710._4_4_ * uStack_720._4_4_;
    local_958 = CONCAT44(local_858,local_6c8);
    uStack_950 = CONCAT44(fStack_6bc,local_7d8);
    local_940 = &local_9b8;
    local_930 = &local_9c8;
    local_878 = CONCAT44(local_858,local_858);
    uStack_870 = CONCAT44(local_858,local_858);
    local_920 = &local_9d8;
    local_7f8 = CONCAT44(local_7d8,local_7d8);
    uStack_7f0 = CONCAT44(local_7d8,local_7d8);
    local_8e8 = &local_9f8;
    local_8a8 = local_6c8 + local_858;
    fStack_8a4 = local_858 + local_858;
    fStack_8a0 = local_7d8 + local_858;
    fStack_89c = fStack_6bc + local_858;
    local_778 = CONCAT44(fStack_8a4,local_8a8);
    uStack_770 = CONCAT44(fStack_89c,fStack_8a0);
    local_8e0 = &local_9e8;
    local_d8c = local_8a8 + local_7d8;
    fStack_8d4 = fStack_8a4 + local_7d8;
    fStack_8d0 = fStack_8a0 + local_7d8;
    fStack_8cc = fStack_89c + local_7d8;
    local_918 = CONCAT44(fStack_8d4,local_d8c);
    uStack_910 = CONCAT44(fStack_8cc,fStack_8d0);
    local_cb8 = local_d40 + 2;
    local_cb0 = &local_da8;
    local_ab8 = *local_cb8;
    uStack_ab0 = local_d40[3];
    local_5d0 = &local_c58;
    local_168._0_4_ = (float)local_ab8;
    local_168._4_4_ = (float)((ulong)local_ab8 >> 0x20);
    uStack_160._0_4_ = (float)uStack_ab0;
    uStack_160._4_4_ = (float)((ulong)uStack_ab0 >> 0x20);
    local_188 = local_a58 * (float)local_168;
    local_4d8 = fStack_a54 * local_168._4_4_;
    local_458 = fStack_a50 * (float)uStack_160;
    fStack_17c = fStack_a4c * uStack_160._4_4_;
    local_5c8 = CONCAT44(local_4d8,local_188);
    uStack_5c0 = CONCAT44(fStack_17c,local_458);
    local_5b0 = &local_5e8;
    local_5a0 = &local_5f8;
    local_4f8 = CONCAT44(local_4d8,local_4d8);
    uStack_4f0 = CONCAT44(local_4d8,local_4d8);
    local_590 = &local_608;
    local_478 = CONCAT44(local_458,local_458);
    uStack_470 = CONCAT44(local_458,local_458);
    local_568 = &local_628;
    local_528 = local_188 + local_4d8;
    fStack_524 = local_4d8 + local_4d8;
    fStack_520 = local_458 + local_4d8;
    fStack_51c = fStack_17c + local_4d8;
    local_3f8 = CONCAT44(fStack_524,local_528);
    uStack_3f0 = CONCAT44(fStack_51c,fStack_520);
    local_560 = &local_618;
    local_558 = local_528 + local_458;
    fStack_554 = fStack_524 + local_458;
    fStack_550 = fStack_520 + local_458;
    fStack_54c = fStack_51c + local_458;
    local_588 = CONCAT44(fStack_554,local_558);
    uStack_580 = CONCAT44(fStack_54c,fStack_550);
    local_d90 = local_558 + local_558;
    local_390 = &local_c78;
    local_128 = local_a58 * local_a58;
    local_298 = fStack_a54 * fStack_a54;
    local_218 = fStack_a50 * fStack_a50;
    fStack_11c = fStack_a4c * fStack_a4c;
    local_388 = CONCAT44(local_298,local_128);
    uStack_380 = CONCAT44(fStack_11c,local_218);
    local_370 = &local_3a8;
    local_360 = &local_3b8;
    local_2b8 = CONCAT44(local_298,local_298);
    uStack_2b0 = CONCAT44(local_298,local_298);
    local_350 = &local_3c8;
    local_238 = CONCAT44(local_218,local_218);
    uStack_230 = CONCAT44(local_218,local_218);
    local_328 = &local_3e8;
    local_2e8 = local_128 + local_298;
    fStack_2e4 = local_298 + local_298;
    fStack_2e0 = local_218 + local_298;
    fStack_2dc = fStack_11c + local_298;
    local_1b8 = CONCAT44(fStack_2e4,local_2e8);
    uStack_1b0 = CONCAT44(fStack_2dc,fStack_2e0);
    local_320 = &local_3d8;
    local_318 = local_2e8 + local_218;
    fStack_314 = fStack_2e4 + local_218;
    fStack_310 = fStack_2e0 + local_218;
    fStack_30c = fStack_2dc + local_218;
    local_348 = CONCAT44(fStack_314,local_318);
    uStack_340 = CONCAT44(fStack_30c,fStack_310);
    local_c30 = *(float *)(local_d60 + 2);
    local_dac = local_318 - local_c30 * local_c30;
    local_db0 = local_d90 * local_d90 + -(local_d8c * 4.0 * local_dac);
    if (0.0 <= local_db0) {
      local_d38 = local_d58;
      local_cf0 = local_d60;
      local_ca8 = local_d40;
      local_ca0 = local_ce8;
      local_c80 = local_c88;
      local_c68 = local_ce0;
      local_c60 = local_ce0;
      local_c40 = local_cb0;
      local_c38 = local_ce0;
      local_c2c = local_db0;
      local_b38 = uVar1;
      uStack_b30 = uVar2;
      local_b28 = local_ad8;
      uStack_b20 = uStack_ad0;
      local_ac0 = local_ce8;
      local_aa0 = local_cb0;
      local_a40 = local_ce0;
      local_970 = local_c88;
      local_968 = local_c88;
      local_960 = local_9a8;
      local_938 = local_940;
      local_928 = local_940;
      local_8f0 = local_920;
      local_8d8 = local_d8c;
      local_8c8 = local_8e0;
      local_8c0 = local_930;
      local_8b8 = local_940;
      local_8b0 = local_8e8;
      local_898 = local_8e8;
      local_890 = local_8e0;
      local_888 = local_940;
      local_880 = local_930;
      local_860 = local_930;
      fStack_854 = local_858;
      fStack_850 = local_858;
      fStack_84c = local_858;
      local_848 = local_958;
      uStack_840 = uStack_950;
      local_830 = local_940;
      local_828 = local_930;
      local_820 = local_940;
      local_818 = local_920;
      local_810 = local_8e8;
      local_808 = local_940;
      local_800 = local_920;
      local_7e0 = local_920;
      fStack_7d4 = local_7d8;
      fStack_7d0 = local_7d8;
      fStack_7cc = local_7d8;
      local_7c8 = local_958;
      uStack_7c0 = uStack_950;
      local_7b0 = local_940;
      local_7a8 = local_878;
      uStack_7a0 = uStack_870;
      local_798 = local_958;
      uStack_790 = uStack_950;
      local_788 = local_7f8;
      uStack_780 = uStack_7f0;
      local_728 = uVar5;
      uStack_720 = uVar6;
      local_718 = uVar3;
      uStack_710 = uVar4;
      fStack_6c4 = local_858;
      fStack_6c0 = local_7d8;
      local_6b0 = local_9a8;
      local_5a8 = local_5b0;
      local_598 = local_5b0;
      local_570 = local_590;
      local_548 = local_560;
      local_540 = local_5a0;
      local_538 = local_5b0;
      local_530 = local_568;
      local_518 = local_568;
      local_510 = local_560;
      local_508 = local_5b0;
      local_500 = local_5a0;
      local_4e0 = local_5a0;
      fStack_4d4 = local_4d8;
      fStack_4d0 = local_4d8;
      fStack_4cc = local_4d8;
      local_4c8 = local_5c8;
      uStack_4c0 = uStack_5c0;
      local_4b0 = local_5b0;
      local_4a8 = local_5a0;
      local_4a0 = local_5b0;
      local_498 = local_590;
      local_490 = local_568;
      local_488 = local_5b0;
      local_480 = local_590;
      local_460 = local_590;
      fStack_454 = local_458;
      fStack_450 = local_458;
      fStack_44c = local_458;
      local_448 = local_5c8;
      uStack_440 = uStack_5c0;
      local_430 = local_5b0;
      local_428 = local_4f8;
      uStack_420 = uStack_4f0;
      local_418 = local_5c8;
      uStack_410 = uStack_5c0;
      local_408 = local_478;
      uStack_400 = uStack_470;
      local_368 = local_370;
      local_358 = local_370;
      local_330 = local_350;
      local_308 = local_320;
      local_300 = local_360;
      local_2f8 = local_370;
      local_2f0 = local_328;
      local_2d8 = local_328;
      local_2d0 = local_320;
      local_2c8 = local_370;
      local_2c0 = local_360;
      local_2a0 = local_360;
      fStack_294 = local_298;
      fStack_290 = local_298;
      fStack_28c = local_298;
      local_288 = local_388;
      uStack_280 = uStack_380;
      local_270 = local_370;
      local_268 = local_360;
      local_260 = local_370;
      local_258 = local_350;
      local_250 = local_328;
      local_248 = local_370;
      local_240 = local_350;
      local_220 = local_350;
      fStack_214 = local_218;
      fStack_210 = local_218;
      fStack_20c = local_218;
      local_208 = local_388;
      uStack_200 = uStack_380;
      local_1f0 = local_370;
      local_1e8 = local_2b8;
      uStack_1e0 = uStack_2b0;
      local_1d8 = local_388;
      uStack_1d0 = uStack_380;
      local_1c8 = local_238;
      uStack_1c0 = uStack_230;
      local_1a0 = local_cb0;
      local_198 = local_ce0;
      local_190 = local_5d0;
      fStack_184 = local_4d8;
      fStack_180 = local_458;
      local_170 = local_5d0;
      local_168 = local_ab8;
      uStack_160 = uStack_ab0;
      local_140 = local_ce0;
      local_138 = local_ce0;
      local_130 = local_390;
      fStack_124 = local_298;
      fStack_120 = local_218;
      local_110 = local_390;
      local_108 = local_158;
      uStack_100 = uStack_150;
      local_f8 = local_158;
      uStack_f0 = uStack_150;
      local_da8 = local_ab8;
      uStack_da0 = uStack_ab0;
      local_d88 = local_ad8;
      uStack_d80 = uStack_ad0;
      local_d78 = local_158;
      uStack_d70 = uStack_150;
      local_c98 = local_958;
      uStack_c90 = uStack_950;
      local_c78 = local_388;
      uStack_c70 = uStack_380;
      local_c58 = local_5c8;
      uStack_c50 = uStack_5c0;
      local_9f8 = local_778;
      uStack_9f0 = uStack_770;
      local_9e8 = local_918;
      uStack_9e0 = uStack_910;
      local_9d8 = local_7f8;
      uStack_9d0 = uStack_7f0;
      local_9c8 = local_878;
      uStack_9c0 = uStack_870;
      local_9b8 = local_958;
      uStack_9b0 = uStack_950;
      local_628 = local_3f8;
      uStack_620 = uStack_3f0;
      local_618 = local_588;
      uStack_610 = uStack_580;
      local_608 = local_478;
      uStack_600 = uStack_470;
      local_5f8 = local_4f8;
      uStack_5f0 = uStack_4f0;
      local_5e8 = local_5c8;
      uStack_5e0 = uStack_5c0;
      local_3e8 = local_1b8;
      uStack_3e0 = uStack_1b0;
      local_3d8 = local_348;
      uStack_3d0 = uStack_340;
      local_3c8 = local_238;
      uStack_3c0 = uStack_230;
      local_3b8 = local_2b8;
      uStack_3b0 = uStack_2b0;
      local_3a8 = local_388;
      uStack_3a0 = uStack_380;
      local_db4 = sqrtf(local_db0);
      local_bfc = local_d8c;
      local_ac = local_d8c;
      local_c8._4_4_ = 0;
      local_c8._0_4_ = local_d8c;
      local_c18 = local_c8._0_8_;
      uStack_c10 = 0;
      local_a8 = local_c8._0_8_;
      uStack_a0 = 0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_c8._0_8_;
      local_c28 = rcpss(auVar7,auVar7);
      local_cc = 0x40000000;
      local_e8 = ZEXT416(0x40000000);
      local_78 = local_c8._0_8_;
      uStack_70 = 0;
      local_68._0_4_ = local_c28._0_4_;
      local_db8 = (float)local_68;
      local_68._4_4_ = local_c28._4_4_;
      local_68._0_4_ = (float)local_68 * local_d8c;
      uStack_900 = local_c28._8_8_;
      local_58 = local_68;
      fVar8 = 2.0 - (float)local_68;
      local_48 = (ulong)(uint)fVar8;
      uStack_40 = 0;
      local_98 = local_48;
      uStack_90 = 0;
      local_db8 = local_db8 * fVar8;
      local_88 = CONCAT44(local_68._4_4_,local_db8);
      local_908 = local_88;
      local_dbc = local_db8 * 0.5 * (-local_d90 - local_db4);
      local_dc0 = local_db8 * 0.5 * (-local_d90 + local_db4);
      local_dec = 0;
      local_de8 = 0;
      local_de0 = *(undefined4 *)(local_d60 + 4);
      local_de4 = local_d4c;
      local_bf0 = local_d40;
      local_c8 = ZEXT416((uint)local_d8c);
      uStack_80 = uStack_900;
      uStack_60 = uStack_900;
      uStack_50 = uStack_900;
      if (*(float *)((long)local_d40 + 0xc) < local_dbc && local_dbc < *(float *)(local_d40 + 4)) {
        local_b70 = local_d40 + 2;
        local_b60 = &local_e38;
        local_b50 = &local_b88;
        local_6d8 = CONCAT44(local_dbc,local_dbc);
        uStack_6d0 = CONCAT44(local_dbc,local_dbc);
        local_990 = &local_e38;
        local_998 = &local_b88;
        uVar1 = *local_b70;
        uVar2 = local_d40[3];
        local_6e8._0_4_ = (float)uVar1;
        local_6e8._4_4_ = (float)((ulong)uVar1 >> 0x20);
        uStack_6e0._0_4_ = (float)uVar2;
        uStack_6e0._4_4_ = (float)((ulong)uVar2 >> 0x20);
        local_688 = local_dbc * (float)local_6e8;
        fStack_684 = local_dbc * local_6e8._4_4_;
        fStack_680 = local_dbc * (float)uStack_6e0;
        fStack_67c = local_dbc * uStack_6e0._4_4_;
        local_670 = &local_e38;
        local_768 = CONCAT44(fStack_684,local_688);
        uStack_760 = CONCAT44(fStack_67c,fStack_680);
        local_bc0 = &local_e28;
        local_bc8 = local_d40;
        local_bd0 = &local_e38;
        uVar3 = *local_d40;
        uVar4 = local_d40[1];
        local_758._0_4_ = (float)uVar3;
        local_758._4_4_ = (float)((ulong)uVar3 >> 0x20);
        uStack_750._0_4_ = (float)uVar4;
        uStack_750._4_4_ = (float)((ulong)uVar4 >> 0x20);
        local_668 = (float)local_758 + local_688;
        fStack_664 = local_758._4_4_ + fStack_684;
        fStack_660 = (float)uStack_750 + fStack_680;
        fStack_65c = uStack_750._4_4_ + fStack_67c;
        local_650 = &local_e28;
        local_b08 = CONCAT44(fStack_664,local_668);
        uStack_b00 = CONCAT44(fStack_65c,fStack_660);
        local_cc0 = &local_e18;
        local_cc8 = &local_e28;
        local_a80 = &local_e18;
        local_cf8 = local_e08;
        local_d00 = &local_e18;
        local_d08 = local_d60;
        uVar5 = *local_d60;
        uVar6 = local_d60[1];
        local_b18._0_4_ = (float)uVar5;
        local_b18._4_4_ = (float)((ulong)uVar5 >> 0x20);
        uStack_b10._0_4_ = (float)uVar6;
        uStack_b10._4_4_ = (float)((ulong)uVar6 >> 0x20);
        local_df8 = local_668 - (float)local_b18;
        local_df4 = fStack_664 - local_b18._4_4_;
        local_df0 = fStack_660 - (float)uStack_b10;
        fStack_a2c = fStack_65c - uStack_b10._4_4_;
        local_a20 = local_e08;
        *(float *)(local_d40 + 4) = local_dbc;
        local_b64 = local_dbc;
        local_b54 = local_dbc;
        local_b18 = uVar5;
        uStack_b10 = uVar6;
        local_a98 = local_b08;
        uStack_a90 = uStack_b00;
        local_a38 = local_df8;
        fStack_a34 = local_df4;
        fStack_a30 = local_df0;
        local_9a0 = local_b70;
        local_758 = uVar3;
        uStack_750 = uVar4;
        local_6e8 = uVar1;
        uStack_6e0 = uVar2;
        local_18 = local_dbc;
        fStack_14 = local_dbc;
        fStack_10 = local_dbc;
        fStack_c = local_dbc;
        fStack_8 = local_dbc;
        local_e38 = local_768;
        uStack_e30 = uStack_760;
        local_e28 = local_b08;
        uStack_e20 = uStack_b00;
        local_e18 = local_b08;
        uStack_e10 = uStack_b00;
        local_b88 = local_6d8;
        uStack_b80 = uStack_6d0;
        memcpy(local_d48,&local_df8,0x30);
        *local_d30 = -1;
      }
      local_bf8 = local_d40;
      if (*(float *)((long)local_d40 + 0xc) < local_dc0 && local_dc0 < *(float *)(local_d40 + 4)) {
        local_ba0 = local_d40 + 2;
        local_b94 = local_dc0;
        local_b40 = &local_bb8;
        local_b44 = local_dc0;
        local_28 = local_dc0;
        local_38 = local_dc0;
        fStack_34 = local_dc0;
        fStack_30 = local_dc0;
        fStack_2c = local_dc0;
        local_6f8 = CONCAT44(local_dc0,local_dc0);
        uStack_6f0 = CONCAT44(local_dc0,local_dc0);
        local_980 = &local_bb8;
        uVar1 = *local_ba0;
        uVar2 = local_d40[3];
        local_708._0_4_ = (float)uVar1;
        local_708._4_4_ = (float)((ulong)uVar1 >> 0x20);
        uStack_700._0_4_ = (float)uVar2;
        uStack_700._4_4_ = (float)((ulong)uVar2 >> 0x20);
        local_6a8 = local_dc0 * (float)local_708;
        fStack_6a4 = local_dc0 * local_708._4_4_;
        fStack_6a0 = local_dc0 * (float)uStack_700;
        fStack_69c = local_dc0 * uStack_700._4_4_;
        local_748 = CONCAT44(fStack_6a4,local_6a8);
        uStack_740 = CONCAT44(fStack_69c,fStack_6a0);
        local_bd8 = &local_e68;
        local_be0 = local_d40;
        uVar3 = *local_d40;
        uVar4 = local_d40[1];
        local_738._0_4_ = (float)uVar3;
        local_738._4_4_ = (float)((ulong)uVar3 >> 0x20);
        uStack_730._0_4_ = (float)uVar4;
        uStack_730._4_4_ = (float)((ulong)uVar4 >> 0x20);
        local_648 = (float)local_738 + local_6a8;
        fStack_644 = local_738._4_4_ + fStack_6a4;
        fStack_640 = (float)uStack_730 + fStack_6a0;
        fStack_63c = uStack_730._4_4_ + fStack_69c;
        local_630 = &local_e68;
        local_ae8 = CONCAT44(fStack_644,local_648);
        uStack_ae0 = CONCAT44(fStack_63c,fStack_640);
        local_cd0 = &local_e58;
        local_cd8 = &local_e68;
        local_a60 = &local_e58;
        local_d10 = local_e48;
        local_d18 = &local_e58;
        local_d20 = local_d60;
        uVar5 = *local_d60;
        uVar6 = local_d60[1];
        local_af8._0_4_ = (float)uVar5;
        local_af8._4_4_ = (float)((ulong)uVar5 >> 0x20);
        uStack_af0._0_4_ = (float)uVar6;
        uStack_af0._4_4_ = (float)((ulong)uVar6 >> 0x20);
        local_df8 = local_648 - (float)local_af8;
        local_df4 = fStack_644 - local_af8._4_4_;
        local_df0 = fStack_640 - (float)uStack_af0;
        fStack_a0c = fStack_63c - uStack_af0._4_4_;
        local_a00 = local_e48;
        *(float *)(local_d40 + 4) = local_dc0;
        local_be8 = (undefined1 *)&local_e78;
        local_b90 = (undefined1 *)&local_e78;
        local_af8 = uVar5;
        uStack_af0 = uVar6;
        local_a78 = local_ae8;
        uStack_a70 = uStack_ae0;
        local_a18 = local_df8;
        fStack_a14 = local_df4;
        fStack_a10 = local_df0;
        local_988 = local_ba0;
        local_978 = (undefined1 *)&local_e78;
        local_738 = uVar3;
        uStack_730 = uVar4;
        local_708 = uVar1;
        uStack_700 = uVar2;
        local_690 = (undefined1 *)&local_e78;
        local_e78 = local_748;
        uStack_e70 = uStack_740;
        local_e68 = local_ae8;
        uStack_e60 = uStack_ae0;
        local_e58 = local_ae8;
        uStack_e50 = uStack_ae0;
        local_bb8 = local_6f8;
        uStack_bb0 = uStack_6f0;
        memcpy(local_d48,&local_df8,0x30);
        *local_d30 = -1;
      }
    }
  }
  return;
}

Assistant:

RTC_SYCL_INDIRECTLY_CALLABLE void sphereIntersectFunc(const RTCIntersectFunctionNArguments* args)
{
  int* valid = args->valid;
  void* ptr  = args->geometryUserPtr;
  Ray *ray = (Ray*)args->rayhit;
  RTCHit* hit = (RTCHit *)&ray->Ng.x;
  unsigned int primID = args->primID;

  if (args->N != 1)
    return;
  const Sphere* spheres = (const Sphere*)ptr;
  const Sphere& sphere = spheres[primID];

  if (!valid[0]) return;
  valid[0] = 0;

  const Vec3fa v = ray->org-sphere.p;
  const float A = dot(ray->dir,ray->dir);
  const float B = 2.0f*dot(v,ray->dir);
  const float C = dot(v,v) - sqr(sphere.r);
  const float D = B*B - 4.0f*A*C;
  if (D < 0.0f) return;
  const float Q = sqrt(D);
  const float rcpA = rcp(A);
  const float t0 = 0.5f*rcpA*(-B-Q);
  const float t1 = 0.5f*rcpA*(-B+Q);

  RTCHit potentialHit;
  potentialHit.u = 0.0f;
  potentialHit.v = 0.0f;
  potentialHit.geomID = sphere.geomID;
  potentialHit.primID = primID;
  if ((ray->tnear() < t0) & (t0 < ray->tfar))
  {
    const Vec3fa Ng = ray->org+t0*ray->dir-sphere.p;
    potentialHit.Ng_x = Ng.x;
    potentialHit.Ng_y = Ng.y;
    potentialHit.Ng_z = Ng.z;
    ray->tfar = t0;
    *hit = potentialHit;
    valid[0] = -1;
  }

  if ((ray->tnear() < t1) & (t1 < ray->tfar))
  {
    const Vec3fa Ng = ray->org+t1*ray->dir-sphere.p;
    potentialHit.Ng_x = Ng.x;
    potentialHit.Ng_y = Ng.y;
    potentialHit.Ng_z = Ng.z;
    ray->tfar = t1;
    *hit = potentialHit;
    valid[0] = -1;
  }
}